

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  ulong __len;
  void *__addr;
  long lVar2;
  long lVar3;
  char *__s;
  long lVar4;
  double local_38;
  
  local_38 = 0.0;
  lVar4 = 8;
  while( true ) {
    if (lVar4 == 0x3f0) {
      printf(anon_var_dwarf_2df7,(long)(local_38 * 0.001));
      return 0;
    }
    load_input(input_t&,std::__cxx11::string_const&)::backsplash =
         mmap(load_input(input_t&,std::__cxx11::string_const&)::backsplash,0x100000,1,
              (uint)(load_input(input_t&,std::__cxx11::string_const&)::backsplash != (void *)0x0) <<
              4 | 0x22,-1,0);
    if (load_input(input_t&,std::__cxx11::string_const&)::backsplash == (void *)0xffffffffffffffff)
    break;
    iVar1 = open(*(char **)((long)&advent2018[0].fn + lVar4),0);
    if (iVar1 == -1) {
LAB_00102b36:
      __s = *(char **)((long)&advent2018[0].fn + lVar4);
      goto LAB_00102b71;
    }
    __len = lseek(iVar1,0,2);
    if (0x100000 < __len) {
      fwrite("Why is your input so big?\n",0x1a,1,_stderr);
      goto LAB_00102b76;
    }
    __addr = mmap(load_input(input_t&,std::__cxx11::string_const&)::backsplash,__len,1,0x12,iVar1,0)
    ;
    if (__addr == (void *)0xffffffffffffffff) break;
    if (__addr != load_input(input_t&,std::__cxx11::string_const&)::backsplash) {
      fwrite("Warning: Input not mapped at the expected location.\n",0x34,1,_stderr);
    }
    iVar1 = close(iVar1);
    if (iVar1 == -1) goto LAB_00102b36;
    lVar2 = std::chrono::_V2::steady_clock::now();
    (**(code **)(lVar4 + 0x11b198))(__addr,__len);
    lVar3 = std::chrono::_V2::steady_clock::now();
    iVar1 = munmap(__addr,__len);
    if (iVar1 == -1) {
      __s = "munmap";
      goto LAB_00102b71;
    }
    local_38 = local_38 + (double)(lVar3 - lVar2);
    printf(anon_var_dwarf_2de1,(long)((double)(lVar3 - lVar2) * 0.001));
    lVar4 = lVar4 + 0x28;
  }
  __s = "mmap";
LAB_00102b71:
  perror(__s);
LAB_00102b76:
  exit(1);
}

Assistant:

int main() {
	double total_time = 0;

	for (auto &A : advent2018) {
		input_t input;

		load_input(input, A.input_file);
		auto t0 = std::chrono::steady_clock::now();
		(*A.fn)(input);
		auto elapsed = std::chrono::steady_clock::now() - t0;
		free_input(input);

		total_time += elapsed.count();
		printf("[%ld μs]\n", int64_t(elapsed.count() * 1e-3));
	}
	printf("Total: %ld μs\n", int64_t(total_time * 1e-3));

	return 0;
}